

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O0

int dlep_reader_status(dlep_status *status,char *text,size_t text_length,dlep_session *session,
                      dlep_parser_value *value)

{
  byte *pbVar1;
  uint8_t *ptr;
  dlep_parser_value *value_local;
  dlep_session *session_local;
  size_t text_length_local;
  char *text_local;
  dlep_status *status_local;
  
  ptr = (uint8_t *)value;
  if ((value == (dlep_parser_value *)0x0) &&
     (ptr = (uint8_t *)dlep_session_get_tlv_value(session,1),
     (dlep_parser_value *)ptr == (dlep_parser_value *)0x0)) {
    status_local._4_4_ = -1;
  }
  else {
    pbVar1 = (session->parser).tlv_ptr + *(ushort *)(ptr + 4);
    *status = (uint)*pbVar1;
    if ((*(ushort *)(ptr + 6) < 2) || (text_length == 0)) {
      if (text_length != 0) {
        *text = '\0';
      }
    }
    else if (text_length < *(ushort *)(ptr + 6)) {
      memcpy(text,pbVar1 + 1,text_length - 1);
      text[text_length - 1] = '\0';
    }
    else {
      memcpy(text,pbVar1 + 1,(long)(int)(*(ushort *)(ptr + 6) - 1));
      text[(int)(*(ushort *)(ptr + 6) - 1)] = '\0';
    }
    status_local._4_4_ = 0;
  }
  return status_local._4_4_;
}

Assistant:

int
dlep_reader_status(enum dlep_status *status, char *text, size_t text_length, struct dlep_session *session,
  struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_STATUS_TLV);
    if (!value) {
      return -1;
    }
  }

  ptr = dlep_session_get_tlv_binary(session, value);
  *status = ptr[0];

  if (value->length > 1 && text_length > 0) {
    /* generate a 0 terminated copy of the text */
    if (text_length >= value->length) {
      memcpy(text, &ptr[1], value->length - 1);
      text[value->length - 1] = 0;
    }
    else {
      memcpy(text, &ptr[1], text_length - 1);
      text[text_length - 1] = 0;
    }
  }
  else if (text_length) {
    *text = 0;
  }
  return 0;
}